

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

run_container_t * run_container_create_given_capacity(int32_t size)

{
  rle16_t *prVar1;
  run_container_t *run;
  run_container_t *prStack_10;
  int32_t size_local;
  
  prStack_10 = (run_container_t *)malloc(0x10);
  if (prStack_10 == (run_container_t *)0x0) {
    prStack_10 = (run_container_t *)0x0;
  }
  else {
    if (size < 1) {
      prStack_10->runs = (rle16_t *)0x0;
    }
    else {
      prVar1 = (rle16_t *)malloc((long)size << 2);
      prStack_10->runs = prVar1;
      if (prVar1 == (rle16_t *)0x0) {
        free(prStack_10);
        return (run_container_t *)0x0;
      }
    }
    prStack_10->capacity = size;
    prStack_10->n_runs = 0;
  }
  return prStack_10;
}

Assistant:

run_container_t *run_container_create_given_capacity(int32_t size) {
    run_container_t *run;
    /* Allocate the run container itself. */
    if ((run = (run_container_t *)malloc(sizeof(run_container_t))) == NULL) {
        return NULL;
    }
    if (size <= 0 ) { // we don't want to rely on malloc(0)
        run->runs = NULL;
    } else if ((run->runs = (rle16_t *)malloc(sizeof(rle16_t) * size)) == NULL) {
        free(run);
        return NULL;
    }
    run->capacity = size;
    run->n_runs = 0;
    return run;
}